

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  bool bVar3;
  ImGuiKeyData *pIVar4;
  ImGuiInputEvent *pIVar5;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  ImGuiInputEvent e;
  int n_1;
  bool found;
  ImGuiKeyData *key_data;
  int n;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_38;
  char local_31;
  int local_24;
  
  pIVar1 = GImGui;
  if (in_ESI != 0) {
    if (*(char *)(in_RDI + 0x37b9) == -1) {
      for (local_24 = 0x200; local_24 < 0x285; local_24 = local_24 + 1) {
      }
    }
    *(undefined1 *)(in_RDI + 0x37b9) = 0;
    bVar3 = ImGui::IsGamepadKey(in_ESI);
    if (bVar3) {
      *(undefined1 *)(in_RDI + 0x37ba) = 0;
    }
    pIVar4 = ImGui::GetKeyData(in_stack_ffffffffffffffa4);
    if ((pIVar4->Down & 1U) == (in_DL & 1)) {
      if ((pIVar4->AnalogValue == in_XMM0_Da) && (!NAN(pIVar4->AnalogValue) && !NAN(in_XMM0_Da))) {
        local_31 = '\0';
        local_38 = (pIVar1->InputEventsQueue).Size;
        while( true ) {
          local_38 = local_38 + -1;
          uVar2 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (-1 < local_38) {
            uVar2 = CONCAT13(local_31,(int3)in_stack_ffffffffffffffa4) ^ 0xff000000;
          }
          in_stack_ffffffffffffffa4 = uVar2;
          if ((in_stack_ffffffffffffffa4 & 0x1000000) == 0) break;
          pIVar5 = ImVector<ImGuiInputEvent>::operator[](&pIVar1->InputEventsQueue,local_38);
          if ((pIVar5->Type == ImGuiInputEventType_Key) &&
             (pIVar5 = ImVector<ImGuiInputEvent>::operator[](&pIVar1->InputEventsQueue,local_38),
             (pIVar5->field_2).MouseButton.Button == in_ESI)) {
            local_31 = '\x01';
          }
        }
        if (local_31 == '\0') {
          return;
        }
      }
    }
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x110b58);
    ImGui::IsGamepadKey(in_ESI);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}